

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O1

void AddCubesToStartingCover(Vec_Wec_t *vEsop)

{
  uint uVar1;
  int *piVar2;
  drow *pdVar3;
  byte bVar4;
  int iVar5;
  int *pVars;
  int *pVarValues;
  long lVar6;
  Cube *pC;
  uint uVar7;
  long lVar8;
  Vec_Int_t *vCube;
  long lVar9;
  
  lVar9 = (long)g_CoverInfo.nVarsIn;
  pVars = (int *)malloc(lVar9 * 4);
  pVarValues = (int *)malloc(lVar9 * 4);
  if (0 < lVar9) {
    lVar6 = 0;
    do {
      pVars[lVar6] = (int)lVar6;
      lVar6 = lVar6 + 1;
    } while (lVar9 != lVar6);
  }
  g_CoverInfo.nLiteralsBefore = 0;
  g_CoverInfo.QCostBefore = 0;
  if (0 < vEsop->nSize) {
    lVar9 = 0;
    do {
      iVar5 = vEsop->pArray[lVar9].nSize;
      if (iVar5 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x3ba,"int Vec_IntPop(Vec_Int_t *)");
      }
      vCube = vEsop->pArray + lVar9;
      piVar2 = vCube->pArray;
      uVar7 = iVar5 - 1;
      vCube->nSize = uVar7;
      uVar7 = piVar2[uVar7];
      lVar6 = (long)g_CoverInfo.nVarsIn;
      if (0 < lVar6) {
        lVar8 = 0;
        do {
          pVarValues[lVar8] = 3;
          lVar8 = lVar8 + 1;
        } while (lVar6 != lVar8);
      }
      if (0 < vCube->nSize) {
        lVar6 = 0;
        do {
          uVar1 = piVar2[lVar6];
          if ((int)uVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          pVarValues[uVar1 >> 1] = 2 - (uVar1 & 1);
          lVar6 = lVar6 + 1;
        } while (lVar6 < vCube->nSize);
      }
      pC = GetFreeCube();
      pdVar3 = pC->pCubeDataIn;
      if (*pdVar3 != 0) {
        if (0 < g_CoverInfo.nWordsIn) {
          lVar6 = 0;
          do {
            pdVar3[lVar6] = 0;
            lVar6 = lVar6 + 1;
          } while (lVar6 < g_CoverInfo.nWordsIn);
        }
        if (0 < g_CoverInfo.nWordsOut) {
          pdVar3 = pC->pCubeDataOut;
          lVar6 = 0;
          do {
            pdVar3[lVar6] = 0;
            lVar6 = lVar6 + 1;
          } while (lVar6 < g_CoverInfo.nWordsOut);
        }
      }
      InsertVarsWithoutClearing(pC,pVars,g_CoverInfo.nVarsIn,pVarValues,~uVar7);
      pC->a = (short)vCube->nSize;
      pC->z = 1;
      iVar5 = ComputeQCost(vCube);
      pC->q = (short)iVar5;
      iVar5 = g_CoverInfo.cIDs + 1;
      bVar4 = (byte)g_CoverInfo.cIDs;
      g_CoverInfo.cIDs = iVar5;
      pC->ID = bVar4;
      if (iVar5 == 0x100) {
        g_CoverInfo.cIDs = 1;
      }
      CheckForCloseCubes(pC,1);
      g_CoverInfo.nLiteralsBefore = g_CoverInfo.nLiteralsBefore + vCube->nSize;
      iVar5 = ComputeQCost(vCube);
      g_CoverInfo.QCostBefore = g_CoverInfo.QCostBefore + iVar5;
      lVar9 = lVar9 + 1;
    } while (lVar9 < vEsop->nSize);
  }
  if (pVars != (int *)0x0) {
    free(pVars);
  }
  if (pVarValues != (int *)0x0) {
    free(pVarValues);
  }
  if (g_CoverInfo.nCubesFree + g_CoverInfo.nCubesInUse == g_CoverInfo.nCubesAlloc) {
    return;
  }
  __assert_fail("g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exor.c"
                ,0x2fd,"void AddCubesToStartingCover(Vec_Wec_t *)");
}

Assistant:

void AddCubesToStartingCover( Vec_Wec_t * vEsop )
{
    Vec_Int_t * vCube;
    Cube * pNew;
    int * s_Level2Var;
    int * s_LevelValues;
    int c, i, k, Lit, Out;

    s_Level2Var = ABC_ALLOC( int, g_CoverInfo.nVarsIn );
    s_LevelValues = ABC_ALLOC( int, g_CoverInfo.nVarsIn );

    for ( i = 0; i < g_CoverInfo.nVarsIn; i++ )
        s_Level2Var[i] = i;

    g_CoverInfo.nLiteralsBefore = 0;
    g_CoverInfo.QCostBefore = 0;
    Vec_WecForEachLevel( vEsop, vCube, c )
    {
        // get the output of this cube
        Out = -Vec_IntPop(vCube) - 1;

        // fill in the cube with blanks
        for ( i = 0; i < g_CoverInfo.nVarsIn; i++ )
            s_LevelValues[i] = VAR_ABS;
        Vec_IntForEachEntry( vCube, Lit, k )
        {
            if ( Abc_LitIsCompl(Lit) )
                s_LevelValues[Abc_Lit2Var(Lit)] = VAR_NEG;
            else
                s_LevelValues[Abc_Lit2Var(Lit)] = VAR_POS;
        }

        // get the new cube
        pNew = GetFreeCube();
        // consider the need to clear the cube
        if ( pNew->pCubeDataIn[0] ) // this is a recycled cube
        {
            for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
                pNew->pCubeDataIn[i] = 0;
            for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                pNew->pCubeDataOut[i] = 0;
        }

        InsertVarsWithoutClearing( pNew, s_Level2Var, g_CoverInfo.nVarsIn, s_LevelValues, Out );
        // set literal counts
        pNew->a = Vec_IntSize(vCube);
        pNew->z = 1;
        pNew->q = ComputeQCost(vCube);
        // set the ID
        pNew->ID = g_CoverInfo.cIDs++;
        // skip through zero-ID
        if ( g_CoverInfo.cIDs == 256 )
            g_CoverInfo.cIDs = 1;

        // add this cube to storage
        CheckForCloseCubes( pNew, 1 );

        g_CoverInfo.nLiteralsBefore += Vec_IntSize(vCube);
        g_CoverInfo.QCostBefore += ComputeQCost(vCube);
    }
    ABC_FREE( s_Level2Var );
    ABC_FREE( s_LevelValues );

    assert ( g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc );
}